

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::TableBinding::ColumnNotFoundError
          (ErrorData *__return_storage_ptr__,TableBinding *this,string *column_name)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  allocator local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58 [32];
  string candidate_message;
  
  ::std::__cxx11::string::string((string *)&local_d8,"Candidate bindings: ",&local_d9);
  StringUtil::CandidatesErrorMessage
            (&candidate_message,&(this->super_Binding).names,column_name,&local_d8,5);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::string
            (local_58,"Table \"%s\" does not have a column named \"%s\"\n%s",&local_d9);
  psVar1 = BindingAlias::GetAlias_abi_cxx11_(&(this->super_Binding).alias);
  ::std::__cxx11::string::string((string *)&local_78,(string *)psVar1);
  ::std::__cxx11::string::string((string *)&local_98,(string *)column_name);
  ::std::__cxx11::string::string((string *)&local_b8,(string *)&candidate_message);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_d8,(StringUtil *)local_58,&local_78,&local_98,&local_b8,in_R9);
  ErrorData::ErrorData(__return_storage_ptr__,BINDER,&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string((string *)&candidate_message);
  return __return_storage_ptr__;
}

Assistant:

ErrorData TableBinding::ColumnNotFoundError(const string &column_name) const {
	auto candidate_message = StringUtil::CandidatesErrorMessage(names, column_name, "Candidate bindings: ");
	return ErrorData(ExceptionType::BINDER, StringUtil::Format("Table \"%s\" does not have a column named \"%s\"\n%s",
	                                                           alias.GetAlias(), column_name, candidate_message));
}